

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readRanges.hpp
# Opt level: O2

vector<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
* __thiscall
njoy::ENDFtk::section::Type<2,151>::Isotope::
readRanges<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
           *__return_storage_ptr__,Isotope *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LFW,int NER)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *end_00;
  Isotope *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *begin_00;
  _Head_base<2UL,_long,_false> _Var1;
  undefined8 *puVar2;
  bool bVar3;
  int in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int local_1a0;
  int NAPS;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_198;
  Isotope *local_190;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_188;
  long local_180;
  double EH;
  double EL;
  ControlRecord cont;
  optional<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> radius;
  ResonanceParameters parameters;
  
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = end;
  if (-1 < LFW) {
    local_1a0 = LFW;
    std::
    vector<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ResonanceRange>_>
    ::reserve(__return_storage_ptr__,(ulong)(uint)LFW);
    local_190 = this;
    local_188 = begin;
    while( true ) {
      begin_00 = local_188;
      this_00 = local_190;
      end_00 = local_198;
      bVar3 = local_1a0 == 0;
      local_1a0 = local_1a0 + -1;
      if (bVar3) break;
      ControlRecord::ControlRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&cont,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_190,local_188,(long *)local_198,(int)lineNumber,MAT,MF);
      _Var1 = cont.
              super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
              .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>;
      EL = cont.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Head_base<0UL,_double,_false>._M_head_impl;
      EH = cont.
           super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
           .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
      local_180 = cont.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                  _M_head_impl;
      NAPS = (int)cont.
                  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                  super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
      readScatteringRadius<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&radius,this_00,begin_00,end_00,(long *)((ulong)lineNumber & 0xffffffff),MAT,MF,
                 (int)cont.
                      super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
                      .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                      super__Head_base<4UL,_long,_false>._M_head_impl,in_stack_fffffffffffffe48);
      readParameters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&parameters,this_00,begin_00,end_00,(long *)((ulong)lineNumber & 0xffffffff),MAT,MF
                 ,(int)_Var1._M_head_impl,(int)local_180,MT,in_stack_fffffffffffffe48);
      std::
      vector<njoy::ENDFtk::section::Type<2,151>::ResonanceRange,std::allocator<njoy::ENDFtk::section::Type<2,151>::ResonanceRange>>
      ::
      emplace_back<double&,double&,int&,std::variant<njoy::ENDFtk::section::Type<2,151>::SpecialCase,njoy::ENDFtk::section::Type<2,151>::SingleLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::MultiLevelBreitWigner,njoy::ENDFtk::section::Type<2,151>::ReichMoore,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyIndependent,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependentFissionWidths,njoy::ENDFtk::section::Type<2,151>::UnresolvedEnergyDependent>,std::optional<njoy::ENDFtk::section::Type<2,151>::ScatteringRadius>>
                ((vector<njoy::ENDFtk::section::Type<2,151>::ResonanceRange,std::allocator<njoy::ENDFtk::section::Type<2,151>::ResonanceRange>>
                  *)__return_storage_ptr__,&EL,&EH,&NAPS,
                 (variant<njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                  *)&parameters,&radius);
      std::__detail::__variant::
      _Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
      ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::SpecialCase,_njoy::ENDFtk::section::Type<2,_151>::SingleLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::MultiLevelBreitWigner,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependentFissionWidths,_njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyDependent>
                           *)&parameters);
      std::_Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius>::_M_reset
                ((_Optional_payload_base<njoy::ENDFtk::section::Type<2,_151>::ScatteringRadius> *)
                 &radius);
    }
    return __return_storage_ptr__;
  }
  tools::Log::error<char_const*>
            ((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  tools::Log::info<char_const*>
            ((char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  tools::Log::info<char_const*,int>("NER value: {}",LFW);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< ResonanceRange >
readRanges( Iterator& begin, const Iterator& end, long& lineNumber,
            int MAT, int MF, int MT,
            int LFW, int NER ) {

  std::vector< ResonanceRange > ranges;

  if ( NER < 0 ) {

    Log::error( "Encountered illegal NER value" );
    Log::info( "NER required to be zero or greater" );
    Log::info( "NER value: {}", NER );
    throw std::exception();
  }

  ranges.reserve( NER );

  while( NER-- ) {

    ControlRecord cont( begin, end, lineNumber, MAT, MF, MT );
    double EL = cont.C1();
    double EH = cont.C2();
    int LRU = cont.L1();
    int LRF = cont.L2();
    int NRO = cont.N1();
    int NAPS = cont.N2();

    std::optional< ScatteringRadius > radius =
        readScatteringRadius( begin, end, lineNumber, MAT, MF, MT, NRO );

    ResonanceRange::ResonanceParameters parameters =
        readParameters( begin, end, lineNumber, MAT, MF, MT, LRU, LRF, LFW );

    ranges.emplace_back( EL, EH, NAPS,
                         std::move( parameters ), std::move( radius ) );
  }
  return ranges;
}